

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O0

asterism_str asterism_strstrip(asterism_str s)

{
  asterism_str aVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *pcStack_28;
  asterism_str s_local;
  
  s_local.p = (char *)s.len;
  pcStack_28 = s.p;
  while( true ) {
    bVar3 = false;
    if (s_local.p != (char *)0x0) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*pcStack_28] & 0x2000) != 0;
    }
    if (!bVar3) break;
    pcStack_28 = pcStack_28 + 1;
    s_local.p = s_local.p + -1;
  }
  while( true ) {
    bVar3 = false;
    if (s_local.p != (char *)0x0) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)(pcStack_28 + -1)[(long)s_local.p]] & 0x2000) != 0;
    }
    if (!bVar3) break;
    s_local.p = s_local.p + -1;
  }
  aVar1.len = (size_t)s_local.p;
  aVar1.p = pcStack_28;
  return aVar1;
}

Assistant:

struct asterism_str asterism_strstrip(struct asterism_str s)
{
    while (s.len > 0 && isspace((int)*s.p))
    {
        s.p++;
        s.len--;
    }
    while (s.len > 0 && isspace((int)*(s.p + s.len - 1)))
    {
        s.len--;
    }
    return s;
}